

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O0

void luaL_addvalue(luaL_Buffer *B)

{
  int iVar1;
  char *__src;
  char *s;
  size_t vl;
  lua_State *L;
  luaL_Buffer *B_local;
  
  vl = (size_t)B->L;
  L = (lua_State *)B;
  __src = lua_tolstring((lua_State *)vl,-1,(size_t *)&s);
  if ((char *)(0x2000 - ((L->nextgc).gcptr64 - (long)&L->gclist)) < s) {
    iVar1 = emptybuffer((luaL_Buffer *)L);
    if (iVar1 != 0) {
      lua_insert((lua_State *)vl,-2);
    }
    *(int *)&L->marked = *(int *)&L->marked + 1;
    adjuststack((luaL_Buffer *)L);
  }
  else {
    memcpy((void *)(L->nextgc).gcptr64,__src,(size_t)s);
    (L->nextgc).gcptr64 = (uint64_t)(s + (L->nextgc).gcptr64);
    lua_settop((lua_State *)vl,-2);
  }
  return;
}

Assistant:

LUALIB_API void luaL_addvalue(luaL_Buffer *B)
{
  lua_State *L = B->L;
  size_t vl;
  const char *s = lua_tolstring(L, -1, &vl);
  if (vl <= bufffree(B)) {  /* fit into buffer? */
    memcpy(B->p, s, vl);  /* put it there */
    B->p += vl;
    lua_pop(L, 1);  /* remove from stack */
  } else {
    if (emptybuffer(B))
      lua_insert(L, -2);  /* put buffer before new value */
    B->lvl++;  /* add new value into B stack */
    adjuststack(B);
  }
}